

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

int CreateBloodTranslation(PalEntry color)

{
  uchar a;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  PalEntry *pPVar4;
  FRemapTable *this;
  FRemapTablePtr local_50;
  uint local_48;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_44;
  int entry;
  PalEntry pe;
  int bright;
  FRemapTable *trans;
  FRemapTablePtr local_20;
  uint local_14;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_10;
  uint i;
  PalEntry color_local;
  
  local_10 = color.field_0;
  uVar2 = TArray<PalEntry,_PalEntry>::Size(&BloodTranslationColors);
  if (uVar2 == 0) {
    FRemapTablePtr::FRemapTablePtr(&local_20,(FRemapTable *)0x0);
    TArray<FRemapTablePtr,_FRemapTable_*>::Push
              (&translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>,&local_20);
    PalEntry::PalEntry((PalEntry *)((long)&trans + 4),0);
    TArray<PalEntry,_PalEntry>::Push(&BloodTranslationColors,(PalEntry *)((long)&trans + 4));
  }
  local_14 = 1;
  while( true ) {
    uVar2 = local_14;
    uVar3 = TArray<PalEntry,_PalEntry>::Size(&BloodTranslationColors);
    if (uVar3 <= uVar2) {
      uVar2 = TArray<PalEntry,_PalEntry>::Size(&BloodTranslationColors);
      if (0xfffe < uVar2) {
        I_Error("Too many blood colors");
      }
      this = (FRemapTable *)operator_new(0x20);
      FRemapTable::FRemapTable(this,0x100);
      for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
        a = MAX<unsigned_char>(GPalette.BaseColors[local_14].field_0.field_0.r,
                               GPalette.BaseColors[local_14].field_0.field_0.g);
        bVar1 = MAX<unsigned_char>(a,GPalette.BaseColors[local_14].field_0.field_0.b);
        entry = (int)bVar1;
        PalEntry::PalEntry((PalEntry *)&local_44.field_0,
                           (BYTE)(((local_10.d >> 0x10 & 0xff) * entry) / 0xff),
                           (BYTE)((ulong)(long)(int)((local_10.d >> 8 & 0xff) * entry) / 0xff),
                           (BYTE)(((local_10.d & 0xff) * entry) / 0xff));
        bVar1 = FColorMatcher::Pick(&ColorMatcher,local_44.d >> 0x10 & 0xff,local_44.d >> 8 & 0xff,
                                    local_44.d & 0xff);
        local_48 = (uint)bVar1;
        this->Palette[local_14].field_0 = local_44;
        this->Remap[local_14] = bVar1;
      }
      FRemapTablePtr::FRemapTablePtr(&local_50,this);
      TArray<FRemapTablePtr,_FRemapTable_*>::Push
                (&translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>,&local_50);
      uVar2 = TArray<PalEntry,_PalEntry>::Push
                        (&BloodTranslationColors,(PalEntry *)&local_10.field_0);
      return uVar2;
    }
    uVar2 = local_10.d >> 0x10;
    pPVar4 = TArray<PalEntry,_PalEntry>::operator[](&BloodTranslationColors,(ulong)local_14);
    if ((((uVar2 & 0xff) == (uint)(pPVar4->field_0).field_0.r) &&
        (uVar2 = local_10.d >> 8,
        pPVar4 = TArray<PalEntry,_PalEntry>::operator[](&BloodTranslationColors,(ulong)local_14),
        (uVar2 & 0xff) == (uint)(pPVar4->field_0).field_0.g)) &&
       (uVar2 = local_10.d & 0xff,
       pPVar4 = TArray<PalEntry,_PalEntry>::operator[](&BloodTranslationColors,(ulong)local_14),
       uVar2 == (pPVar4->field_0).field_0.b)) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int CreateBloodTranslation(PalEntry color)
{
	unsigned int i;

	if (BloodTranslationColors.Size() == 0)
	{
		// Don't use the first slot.
		translationtables[TRANSLATION_Blood].Push(NULL);
		BloodTranslationColors.Push(0);
	}

	for (i = 1; i < BloodTranslationColors.Size(); i++)
	{
		if (color.r == BloodTranslationColors[i].r &&
			color.g == BloodTranslationColors[i].g &&
			color.b == BloodTranslationColors[i].b)
		{
			// A duplicate of this translation already exists
			return i;
		}
	}
	if (BloodTranslationColors.Size() >= MAX_DECORATE_TRANSLATIONS)
	{
		I_Error("Too many blood colors");
	}
	FRemapTable *trans = new FRemapTable;
	for (i = 0; i < 256; i++)
	{
		int bright = MAX(MAX(GPalette.BaseColors[i].r, GPalette.BaseColors[i].g), GPalette.BaseColors[i].b);
		PalEntry pe = PalEntry(color.r*bright/255, color.g*bright/255, color.b*bright/255);
		int entry = ColorMatcher.Pick(pe.r, pe.g, pe.b);

		trans->Palette[i] = pe;
		trans->Remap[i] = entry;
	}
	translationtables[TRANSLATION_Blood].Push(trans);
	return BloodTranslationColors.Push(color);
}